

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::ErrorCheckEndFrameRecover(ImGuiErrorLogCallback log_callback,void *user_data)

{
  ImGuiWindow *pIVar1;
  ImGuiContext *pIVar2;
  undefined8 in_RSI;
  code *in_RDI;
  ImGuiWindow *window;
  ImGuiContext *g;
  
  pIVar2 = GImGui;
  while( true ) {
    if ((pIVar2->CurrentWindowStack).Size < 1) {
      return;
    }
    ErrorCheckEndWindowRecover((ImGuiErrorLogCallback)g,window);
    pIVar1 = pIVar2->CurrentWindow;
    if ((pIVar2->CurrentWindowStack).Size == 1) break;
    if ((pIVar1->Flags & 0x1000000U) == 0) {
      if (in_RDI != (code *)0x0) {
        (*in_RDI)(in_RSI,"Recovered from missing End() for \'%s\'",pIVar1->Name);
      }
      End();
    }
    else {
      if (in_RDI != (code *)0x0) {
        (*in_RDI)(in_RSI,"Recovered from missing EndChild() for \'%s\'",pIVar1->Name);
      }
      EndChild();
    }
  }
  return;
}

Assistant:

void    ImGui::ErrorCheckEndFrameRecover(ImGuiErrorLogCallback log_callback, void* user_data)
{
    // PVS-Studio V1044 is "Loop break conditions do not depend on the number of iterations"
    ImGuiContext& g = *GImGui;
    while (g.CurrentWindowStack.Size > 0) //-V1044
    {
        ErrorCheckEndWindowRecover(log_callback, user_data);
        ImGuiWindow* window = g.CurrentWindow;
        if (g.CurrentWindowStack.Size == 1)
        {
            IM_ASSERT(window->IsFallbackWindow);
            break;
        }
        IM_ASSERT(window == g.CurrentWindow);
        if (window->Flags & ImGuiWindowFlags_ChildWindow)
        {
            if (log_callback) log_callback(user_data, "Recovered from missing EndChild() for '%s'", window->Name);
            EndChild();
        }
        else
        {
            if (log_callback) log_callback(user_data, "Recovered from missing End() for '%s'", window->Name);
            End();
        }
    }
}